

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::ByteSizeLong
          (ItemSimilarityRecommender_SimilarItems *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  uint64_t uVar3;
  size_t sVar4;
  long lVar5;
  double dVar6;
  int cached_size;
  uint64_t raw_itemscoreadjustment;
  double tmp_itemscoreadjustment;
  ItemSimilarityRecommender_ConnectedItem *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  ItemSimilarityRecommender_SimilarItems *this_local;
  
  iVar2 = _internal_similaritemlist_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::
           RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::begin
                     (&this->similaritemlist_);
  msg = (ItemSimilarityRecommender_ConnectedItem *)
        google::protobuf::
        RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::end
                  (&this->similaritemlist_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                 ::operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
            ::operator*(&__end2);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>(value);
    sStack_18 = sVar4 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::
    operator++(&__end2);
  }
  uVar3 = _internal_itemid(this);
  if (uVar3 != 0) {
    uVar3 = _internal_itemid(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar3);
    sStack_18 = sVar4 + sStack_18;
  }
  dVar6 = _internal_itemscoreadjustment(this);
  if (dVar6 != 0.0) {
    sStack_18 = sStack_18 + 9;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_18 = lVar5 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t ItemSimilarityRecommender_SimilarItems::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
  total_size += 1UL * this->_internal_similaritemlist_size();
  for (const auto& msg : this->similaritemlist_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // uint64 itemId = 1;
  if (this->_internal_itemid() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_itemid());
  }

  // double itemScoreAdjustment = 3;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_itemscoreadjustment = this->_internal_itemscoreadjustment();
  uint64_t raw_itemscoreadjustment;
  memcpy(&raw_itemscoreadjustment, &tmp_itemscoreadjustment, sizeof(tmp_itemscoreadjustment));
  if (raw_itemscoreadjustment != 0) {
    total_size += 1 + 8;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}